

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.h
# Opt level: O3

cmplx __thiscall klogic::mvn::output(mvn *this,cvector *X)

{
  uint uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  cmplx cVar6;
  undefined1 local_28 [16];
  
  uVar1 = this->k;
  weighted_sum(this,(X->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
               (X->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish);
  if (uVar1 == 0) {
    local_28._4_4_ = extraout_XMM0_Db;
    local_28._0_4_ = extraout_XMM0_Da;
    dVar3 = cabs((double)local_28._0_8_);
    local_28._8_8_ = in_XMM1_Qa;
    auVar2._8_4_ = SUB84(dVar3,0);
    auVar2._0_8_ = dVar3;
    auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
    divpd(local_28,auVar2);
    uVar4 = extraout_RAX_00;
    uVar5 = extraout_RDX_00;
  }
  else {
    dVar3 = carg((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    dVar3 = floor(((double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar3 |
                           (ulong)(dVar3 + 6.283185307179586) & -(ulong)(dVar3 < 0.0)) /
                  6.283185307179586) * (double)(int)uVar1);
    if (((int)uVar1 < 1) || (uVar1 <= (uint)(int)(dVar3 + 0.5))) {
      __assert_fail("k > 0 && n >= 0 && n < k",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/klogic.h"
                    ,0x11,"cmplx klogic::epsilon(unsigned int, int)");
    }
    dVar3 = ((double)(int)(dVar3 + 0.5) * 6.283185307179586) / (double)(int)uVar1;
    cos(dVar3);
    sin(dVar3);
    uVar4 = extraout_RAX;
    uVar5 = extraout_RDX;
  }
  cVar6._M_value._8_8_ = uVar5;
  cVar6._M_value._0_8_ = uVar4;
  return (cmplx)cVar6._M_value;
}

Assistant:

cmplx output(const cvector &X) const {
            return activation(k, weighted_sum(X.begin(), X.end()));
        }